

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O3

void ch_end(EditLine *el)

{
  wchar_t *pwVar1;
  
  free((el->el_line).buffer);
  (el->el_line).buffer = (wchar_t *)0x0;
  (el->el_line).limit = (wchar_t *)0x0;
  free((el->el_chared).c_undo.buf);
  (el->el_chared).c_undo.buf = (wchar_t *)0x0;
  free((el->el_chared).c_redo.buf);
  (el->el_chared).c_redo.lim = (wchar_t *)0x0;
  (el->el_chared).c_redo.buf = (wchar_t *)0x0;
  (el->el_chared).c_redo.pos = (wchar_t *)0x0;
  (el->el_chared).c_redo.cmd = '\x1c';
  free((el->el_chared).c_kill.buf);
  (el->el_chared).c_kill.buf = (wchar_t *)0x0;
  pwVar1 = (el->el_line).buffer;
  (el->el_line).cursor = pwVar1;
  (el->el_line).lastchar = pwVar1;
  (el->el_chared).c_undo.len = -1;
  (el->el_chared).c_undo.cursor = L'\0';
  (el->el_chared).c_vcmd.action = L'\0';
  (el->el_chared).c_vcmd.pos = pwVar1;
  (el->el_chared).c_kill.mark = pwVar1;
  (el->el_map).current = (el->el_map).key;
  (el->el_state).inputmode = L'\0';
  (el->el_state).doingarg = L'\0';
  (el->el_state).argument = L'\x01';
  (el->el_state).metanext = L'\0';
  (el->el_state).lastcmd = '\x1c';
  (el->el_history).eventno = L'\0';
  return;
}

Assistant:

libedit_private void
ch_end(EditLine *el)
{
	el_free(el->el_line.buffer);
	el->el_line.buffer = NULL;
	el->el_line.limit = NULL;
	el_free(el->el_chared.c_undo.buf);
	el->el_chared.c_undo.buf = NULL;
	el_free(el->el_chared.c_redo.buf);
	el->el_chared.c_redo.buf = NULL;
	el->el_chared.c_redo.pos = NULL;
	el->el_chared.c_redo.lim = NULL;
	el->el_chared.c_redo.cmd = ED_UNASSIGNED;
	el_free(el->el_chared.c_kill.buf);
	el->el_chared.c_kill.buf = NULL;
	ch_reset(el);
}